

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkcs8.cc
# Opt level: O0

int pkcs8_pbe_decrypt(uint8_t **out,size_t *out_len,CBS *algorithm,char *pass,size_t pass_len,
                     uint8_t *in,size_t in_len)

{
  _func_int_pbe_suite_ptr_EVP_CIPHER_CTX_ptr_char_ptr_size_t_CBS_ptr *p_Var1;
  pbe_suite *ppVar2;
  int iVar3;
  evp_cipher_ctx_st *peVar4;
  EVP_CIPHER_CTX *pEVar5;
  int local_104;
  int local_100;
  int n2;
  int n1;
  uint i;
  pbe_suite *suite;
  CBS obj;
  ScopedEVP_CIPHER_CTX ctx;
  uint8_t *buf;
  int ret;
  uint8_t *in_local;
  size_t pass_len_local;
  char *pass_local;
  CBS *algorithm_local;
  size_t *out_len_local;
  uint8_t **out_local;
  
  buf._4_4_ = 0;
  ctx.ctx_.poisoned = 0;
  ctx.ctx_._148_4_ = 0;
  bssl::internal::
  StackAllocated<evp_cipher_ctx_st,_int,_&EVP_CIPHER_CTX_init,_&EVP_CIPHER_CTX_cleanup>::
  StackAllocated((StackAllocated<evp_cipher_ctx_st,_int,_&EVP_CIPHER_CTX_init,_&EVP_CIPHER_CTX_cleanup>
                  *)&obj.len);
  _n1 = (pbe_suite *)0x0;
  iVar3 = CBS_get_asn1(algorithm,(CBS *)&suite,6);
  if (iVar3 == 0) {
    ERR_put_error(0x13,0,0x68,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs8/pkcs8.cc"
                  ,0x149);
  }
  else {
    for (n2 = 0; (uint)n2 < 4; n2 = n2 + 1) {
      iVar3 = CBS_mem_equal((CBS *)&suite,kBuiltinPBE[(uint)n2].oid,
                            (ulong)kBuiltinPBE[(uint)n2].oid_len);
      if (iVar3 != 0) {
        _n1 = kBuiltinPBE + (uint)n2;
        break;
      }
    }
    ppVar2 = _n1;
    if (_n1 == (pbe_suite *)0x0) {
      ERR_put_error(0x13,0,0x77,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs8/pkcs8.cc"
                    ,0x154);
    }
    else {
      p_Var1 = _n1->decrypt_init;
      peVar4 = bssl::internal::
               StackAllocated<evp_cipher_ctx_st,_int,_&EVP_CIPHER_CTX_init,_&EVP_CIPHER_CTX_cleanup>
               ::get((StackAllocated<evp_cipher_ctx_st,_int,_&EVP_CIPHER_CTX_init,_&EVP_CIPHER_CTX_cleanup>
                      *)&obj.len);
      iVar3 = (*p_Var1)(ppVar2,peVar4,pass,pass_len,algorithm);
      if (iVar3 == 0) {
        ERR_put_error(0x13,0,0x6d,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs8/pkcs8.cc"
                      ,0x159);
      }
      else {
        ctx.ctx_._144_8_ = OPENSSL_malloc(in_len);
        if ((uchar *)ctx.ctx_._144_8_ != (uchar *)0x0) {
          if (in_len < 0x80000000) {
            pEVar5 = (EVP_CIPHER_CTX *)
                     bssl::internal::
                     StackAllocated<evp_cipher_ctx_st,_int,_&EVP_CIPHER_CTX_init,_&EVP_CIPHER_CTX_cleanup>
                     ::get((StackAllocated<evp_cipher_ctx_st,_int,_&EVP_CIPHER_CTX_init,_&EVP_CIPHER_CTX_cleanup>
                            *)&obj.len);
            iVar3 = EVP_DecryptUpdate(pEVar5,(uchar *)ctx.ctx_._144_8_,&local_100,in,(int)in_len);
            if (iVar3 != 0) {
              pEVar5 = (EVP_CIPHER_CTX *)
                       bssl::internal::
                       StackAllocated<evp_cipher_ctx_st,_int,_&EVP_CIPHER_CTX_init,_&EVP_CIPHER_CTX_cleanup>
                       ::get((StackAllocated<evp_cipher_ctx_st,_int,_&EVP_CIPHER_CTX_init,_&EVP_CIPHER_CTX_cleanup>
                              *)&obj.len);
              iVar3 = EVP_DecryptFinal_ex(pEVar5,(uchar *)(ctx.ctx_._144_8_ + (long)local_100),
                                          &local_104);
              if (iVar3 != 0) {
                *out = (uint8_t *)ctx.ctx_._144_8_;
                *out_len = (long)(local_100 + local_104);
                buf._4_4_ = 1;
                ctx.ctx_.poisoned = 0;
                ctx.ctx_._148_4_ = 0;
              }
            }
          }
          else {
            ERR_put_error(0x13,0,0x45,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs8/pkcs8.cc"
                          ,0x163);
          }
        }
      }
    }
  }
  OPENSSL_free((void *)ctx.ctx_._144_8_);
  bssl::internal::
  StackAllocated<evp_cipher_ctx_st,_int,_&EVP_CIPHER_CTX_init,_&EVP_CIPHER_CTX_cleanup>::
  ~StackAllocated((StackAllocated<evp_cipher_ctx_st,_int,_&EVP_CIPHER_CTX_init,_&EVP_CIPHER_CTX_cleanup>
                   *)&obj.len);
  return buf._4_4_;
}

Assistant:

int pkcs8_pbe_decrypt(uint8_t **out, size_t *out_len, CBS *algorithm,
                      const char *pass, size_t pass_len, const uint8_t *in,
                      size_t in_len) {
  int ret = 0;
  uint8_t *buf = NULL;
  bssl::ScopedEVP_CIPHER_CTX ctx;

  CBS obj;
  const struct pbe_suite *suite = NULL;
  if (!CBS_get_asn1(algorithm, &obj, CBS_ASN1_OBJECT)) {
    OPENSSL_PUT_ERROR(PKCS8, PKCS8_R_DECODE_ERROR);
    goto err;
  }

  for (unsigned i = 0; i < OPENSSL_ARRAY_SIZE(kBuiltinPBE); i++) {
    if (CBS_mem_equal(&obj, kBuiltinPBE[i].oid, kBuiltinPBE[i].oid_len)) {
      suite = &kBuiltinPBE[i];
      break;
    }
  }
  if (suite == NULL) {
    OPENSSL_PUT_ERROR(PKCS8, PKCS8_R_UNKNOWN_ALGORITHM);
    goto err;
  }

  if (!suite->decrypt_init(suite, ctx.get(), pass, pass_len, algorithm)) {
    OPENSSL_PUT_ERROR(PKCS8, PKCS8_R_KEYGEN_FAILURE);
    goto err;
  }

  buf = reinterpret_cast<uint8_t *>(OPENSSL_malloc(in_len));
  if (buf == NULL) {
    goto err;
  }

  if (in_len > INT_MAX) {
    OPENSSL_PUT_ERROR(PKCS8, ERR_R_OVERFLOW);
    goto err;
  }

  int n1, n2;
  if (!EVP_DecryptUpdate(ctx.get(), buf, &n1, in, (int)in_len) ||
      !EVP_DecryptFinal_ex(ctx.get(), buf + n1, &n2)) {
    goto err;
  }

  *out = buf;
  *out_len = n1 + n2;
  ret = 1;
  buf = NULL;

err:
  OPENSSL_free(buf);
  return ret;
}